

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintingTheDecimalEquivalentOfABinaryNumber.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint local_2c;
  int decimal;
  int numE;
  int numD;
  int numC;
  int numB;
  int numA;
  int flag;
  int number;
  
  flag = 0;
  numB = 1;
  local_2c = 0;
  printf("%s","Enter a valid binary number (up to 5 digits): ");
  __isoc99_scanf("%d",&numA);
  while (numB != -1) {
    local_2c = 0;
    if (numA < 0) {
      puts("You have not entered a binary number");
      printf("%s","Enter a valid binary number (up to 5 digits): ");
      __isoc99_scanf("%d",&numA);
      numB = 1;
    }
    else if (numA < 0x2b68) {
      iVar1 = numA / 10000;
      iVar2 = (numA % 10000) / 1000;
      iVar5 = (numA % 10000) % 1000;
      iVar3 = iVar5 / 100;
      iVar5 = iVar5 % 100;
      iVar4 = iVar5 / 10;
      iVar5 = iVar5 % 10;
      numA = iVar5;
      if (iVar1 == 1) {
        local_2c = 0x10;
      }
      else {
        if (iVar1 != 0) {
          puts("You have not entered a binary number");
          printf("%s","Enter a valid binary number (up to 5 digits): ");
          __isoc99_scanf("%d",&numA);
        }
        local_2c = 0;
      }
      if (iVar2 == 1) {
        local_2c = local_2c + 8;
      }
      else if (iVar2 != 0) {
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",&numA);
      }
      if (iVar3 == 1) {
        local_2c = local_2c + 4;
      }
      else if (iVar3 != 0) {
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",&numA);
      }
      if (iVar4 == 1) {
        local_2c = local_2c + 2;
      }
      else if (iVar4 != 0) {
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",&numA);
      }
      if (iVar5 == 1) {
        local_2c = local_2c + 1;
        numB = -1;
      }
      else if (iVar5 == 0) {
        numB = -1;
      }
      else {
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",&numA);
        numB = 1;
      }
    }
    else {
      puts("You have not entered a binary number");
      printf("%s","Enter a valid binary number (up to 5 digits): ");
      __isoc99_scanf("%d",&numA);
      numB = 1;
    }
  }
  printf("%s%d","The decimal equivalent is: ",(ulong)local_2c);
  return 0;
}

Assistant:

int main (void) {
    int number;
    int flag = 1;
    int numA;
    int numB;
    int numC;
    int numD;
    int numE;
    int decimal = 0;

    printf("%s", "Enter a valid binary number (up to 5 digits): ");
    scanf("%d", &number);
    while (flag != -1) {
        decimal = 0;
        if (number >= 0) {
            if (number <= 11111) {
                numA = number / 10000;
                number = number % 10000;
                numB = number / 1000;
                number = number % 1000;
                numC = number / 100;
                number = number % 100;
                numD = number / 10;
                number = number % 10;
                numE = number;
                if (numA == 1) {
                    decimal = decimal + (numA * 16);
                    flag = -1;

                }
                else if (numA == 0) {
                    decimal = decimal + (numA * 16);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numB == 1) {
                    decimal = decimal + (numB * 8);
                    flag = -1;

                }
                else if (numB == 0) {
                    decimal = decimal + (numB * 8);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numC == 1) {
                    decimal = decimal + (numC * 4);
                    flag = -1;

                }
                else if (numC == 0) {
                    decimal = decimal + (numC * 4);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numD == 1) {
                    decimal = decimal + (numD * 2);
                    flag = -1;

                }
                else if (numD == 0) {
                    decimal = decimal + (numD * 2);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numE == 1) {
                    decimal = decimal + numE ;
                    flag = -1;

                }
                else if (numE == 0) {
                    decimal = decimal + numE;
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

            }
            else {
                puts("You have not entered a binary number");
                printf("%s", "Enter a valid binary number (up to 5 digits): ");
                scanf("%d", &number);
                flag = 1;

            }

        }
        else {
            puts("You have not entered a binary number");
            printf("%s", "Enter a valid binary number (up to 5 digits): ");
            scanf("%d", &number);
            flag = 1;

        }

    }
    printf("%s%d", "The decimal equivalent is: ", decimal);

    return 0;

}